

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.cpp
# Opt level: O0

void __thiscall
pstore::http::report_error
          (http *this,error_code error,request_info *request,socket_descriptor *socket)

{
  bool bVar1;
  int iVar2;
  error_category *peVar3;
  error_category *peVar4;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> sender;
  ostream *poVar5;
  czstring message_00;
  uint *io;
  string local_250 [32];
  string local_230;
  ostringstream local_210 [8];
  ostringstream message;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_90;
  error_category *local_78;
  error_category *cat;
  string local_60;
  undefined1 local_40 [8];
  anon_class_24_3_b371a401 report;
  socket_descriptor *socket_local;
  request_info *request_local;
  error_code error_local;
  
  report.socket = (socket_descriptor *)error._M_cat;
  error_local._0_8_ = error._0_8_;
  request_local._0_4_ = SUB84(this,0);
  report.request = (request_info *)&request_local;
  local_40 = (undefined1  [8])request;
  report.error = (error_code *)request;
  std::error_code::message_abi_cxx11_(&local_60,(error_code *)report.request);
  log<std::__cxx11::string>(error,"http error: ",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  peVar3 = std::error_code::category((error_code *)&request_local);
  local_78 = peVar3;
  peVar4 = get_error_category();
  bVar1 = std::_V2::error_category::operator==(peVar3,peVar4);
  peVar3 = local_78;
  if (!bVar1) {
    peVar4 = &pstore::romfs::get_romfs_error_category()->super_error_category;
    bVar1 = std::_V2::error_category::operator==(peVar3,peVar4);
    if ((bVar1) &&
       ((iVar2 = std::error_code::value((error_code *)&request_local), iVar2 == 2 || (iVar2 == 0x14)
        ))) {
      report_error::anon_class_24_3_b371a401::operator()
                ((anon_class_24_3_b371a401 *)local_40,not_found,"Not found");
      return;
    }
    goto switchD_001ed74c_default;
  }
  iVar2 = std::error_code::value((error_code *)&request_local);
  io = &switchD_001ed74c::switchdataD_0021dba4;
  switch(iVar2) {
  case 1:
    report_error::anon_class_24_3_b371a401::operator()
              ((anon_class_24_3_b371a401 *)local_40,bad_request,"Bad request");
    break;
  case 2:
    sender = std::ref<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>
                       ((descriptor<pstore::details::posix_descriptor_traits> *)report.error);
    (anonymous_namespace)::
    send_bad_websocket_version<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
              (&local_90,(_anonymous_namespace_ *)net::network_sender,
               (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
                *)sender._M_data,
               (reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                )io);
    error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
    ::~error_or(&local_90);
    break;
  case 3:
    report_error::anon_class_24_3_b371a401::operator()
              ((anon_class_24_3_b371a401 *)local_40,not_implemented,"Not implemented");
    break;
  case 4:
  case 5:
  default:
switchD_001ed74c_default:
    std::__cxx11::ostringstream::ostringstream(local_210);
    poVar5 = std::operator<<((ostream *)local_210,"Server internal error: ");
    std::error_code::message_abi_cxx11_(&local_230,(error_code *)&request_local);
    std::operator<<(poVar5,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::ostringstream::str();
    message_00 = (czstring)std::__cxx11::string::c_str();
    report_error::anon_class_24_3_b371a401::operator()
              ((anon_class_24_3_b371a401 *)local_40,internal_server_error,message_00);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::ostringstream::~ostringstream(local_210);
  }
  return;
}

Assistant:

void report_error (std::error_code const error, request_info const & request,
                           socket_descriptor & socket) {
            static constexpr auto sender = net::network_sender;

            auto const report = [&] (http_status_code const code, gsl::czstring const message) {
                send_error_page (sender, std::ref (socket), request.uri ().c_str (), code, message,
                                 error.message ().c_str ());
            };

            log (logger::priority::error, "http error: ", error.message ());
            auto const & cat = error.category ();
            if (cat == get_error_category ()) {
                switch (static_cast<error_code> (error.value ())) {
                case error_code::bad_request:
                    return report (http_status_code::bad_request, "Bad request");

                case error_code::bad_websocket_version:
                    send_bad_websocket_version (sender, std::ref (socket));
                    return;

                case error_code::not_implemented:
                    return report (http_status_code::not_implemented, "Not implemented");

                case error_code::string_too_long:
                case error_code::refill_out_of_range: break;
                }
            } else if (cat == romfs::get_romfs_error_category ()) {
                switch (static_cast<romfs::error_code> (error.value ())) {
                case romfs::error_code::enoent:
                case romfs::error_code::enotdir:
                    return report (http_status_code::not_found, "Not found");

                case romfs::error_code::einval: break;
                }
            }

            // Some error that we don't know how to report properly.
            std::ostringstream message;
            message << "Server internal error: " << error.message ();
            report (http_status_code::internal_server_error, message.str ().c_str ());
        }